

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O0

TRef lj_ir_tonumber(jit_State *J,TRef tr)

{
  TRef local_24;
  TRef tr_local;
  jit_State *J_local;
  
  local_24 = tr;
  if (5 < (tr >> 0x18 & 0x1f) - 0xe) {
    if ((tr & 0x1f000000) != 0x4000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    (J->fold).ins.field_0.ot = 0x5e8e;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = 0;
    local_24 = lj_opt_fold(J);
  }
  return local_24;
}

Assistant:

TRef LJ_FASTCALL lj_ir_tonumber(jit_State *J, TRef tr)
{
  if (!tref_isnumber(tr)) {
    if (tref_isstr(tr))
      tr = emitir(IRTG(IR_STRTO, IRT_NUM), tr, 0);
    else
      lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}